

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::SkipField(CodedInputStream *input,uint32 tag)

{
  bool bVar1;
  int iVar2;
  WireType WVar3;
  uint32 expected;
  CodedInputStream *this;
  uint32 in_ESI;
  CodedInputStream *in_RDI;
  uint32 value_2;
  uint32 length;
  uint64 value_1;
  uint64 value;
  uint64 *in_stack_ffffffffffffffc0;
  uint32 *in_stack_ffffffffffffffd0;
  CodedInputStream *in_stack_ffffffffffffffd8;
  uint64 *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  bool local_1;
  
  iVar2 = GetTagFieldNumber(in_ESI);
  if (iVar2 == 0) {
    local_1 = false;
  }
  else {
    WVar3 = GetTagWireType(in_ESI);
    this = (CodedInputStream *)(ulong)WVar3;
    switch(this) {
    case (CodedInputStream *)0x0:
      bVar1 = io::CodedInputStream::ReadVarint64
                        ((CodedInputStream *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         in_stack_ffffffffffffffe0);
      if (bVar1) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
      break;
    case (CodedInputStream *)0x1:
      bVar1 = io::CodedInputStream::ReadLittleEndian64(this,in_stack_ffffffffffffffc0);
      if (bVar1) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
      break;
    case (CodedInputStream *)0x2:
      bVar1 = io::CodedInputStream::ReadVarint32
                        (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      if (bVar1) {
        bVar1 = io::CodedInputStream::Skip(this,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
        if (bVar1) {
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
      break;
    case (CodedInputStream *)0x3:
      bVar1 = io::CodedInputStream::IncrementRecursionDepth(in_RDI);
      if (bVar1) {
        bVar1 = SkipMessage(this);
        if (bVar1) {
          io::CodedInputStream::DecrementRecursionDepth(in_RDI);
          iVar2 = GetTagFieldNumber(in_ESI);
          expected = MakeTag(iVar2,WIRETYPE_END_GROUP);
          bVar1 = io::CodedInputStream::LastTagWas(in_RDI,expected);
          if (bVar1) {
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
      break;
    case (CodedInputStream *)0x4:
      local_1 = false;
      break;
    case (CodedInputStream *)0x5:
      bVar1 = io::CodedInputStream::ReadLittleEndian32(this,(uint32 *)in_stack_ffffffffffffffc0);
      if (bVar1) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
      break;
    default:
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool WireFormatLite::SkipField(io::CodedInputStream* input, uint32 tag) {
  // Field number 0 is illegal.
  if (WireFormatLite::GetTagFieldNumber(tag) == 0) return false;
  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64 value;
      if (!input->ReadVarint64(&value)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64 value;
      if (!input->ReadLittleEndian64(&value)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32 length;
      if (!input->ReadVarint32(&length)) return false;
      if (!input->Skip(length)) return false;
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input)) return false;
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(
              WireFormatLite::MakeTag(WireFormatLite::GetTagFieldNumber(tag),
                                      WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32 value;
      if (!input->ReadLittleEndian32(&value)) return false;
      return true;
    }
    default: {
      return false;
    }
  }
}